

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O3

time_t time(time_t *__timer)

{
  int iVar1;
  time_t tVar2;
  timeval tv;
  timeval local_18;
  
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  tVar2 = -1;
  if ((iVar1 == 0) && (tVar2 = local_18.tv_sec, __timer != (time_t *)0x0)) {
    *__timer = local_18.tv_sec;
  }
  return tVar2;
}

Assistant:

time_t time( time_t * timer )
{
    struct timeval tv;

    if ( gettimeofday( &tv, NULL ) == 0 )
    {
        if ( timer != NULL )
        {
            *timer = tv.tv_sec;
        }

        return tv.tv_sec;
    }

    return -1;
}